

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  anon_union_8_2_443a03b8_for_u *paVar2;
  Expr *in_RDX;
  Expr *in_RSI;
  ExprList *in_RDI;
  ExprList_item *pItem;
  sqlite3 *in_stack_fffffffffffffff8;
  
  if (in_RSI == (Expr *)0x0) {
    in_RSI = (Expr *)sqlite3ExprListAppendNew((sqlite3 *)0x0,in_RDX);
  }
  else if ((int)in_RSI->flags < *(int *)in_RSI + 1) {
    in_RSI = (Expr *)sqlite3ExprListAppendGrow(in_stack_fffffffffffffff8,in_RDI,in_RSI);
  }
  else {
    iVar1 = *(int *)in_RSI;
    *(int *)in_RSI = iVar1 + 1;
    paVar2 = &in_RSI->u + (long)iVar1 * 3;
    paVar2->zToken = (char *)(Expr *)0x0;
    paVar2[1].zToken = (char *)0x0;
    paVar2[2] = (anon_union_8_2_443a03b8_for_u)0;
    paVar2->zToken = (char *)in_RDX;
  }
  return (ExprList *)in_RSI;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  if( pList==0 ){
    return sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  if( pList->nAlloc<pList->nExpr+1 ){
    return sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}